

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O2

int xmlNoNetExists(char *filename)

{
  int iVar1;
  char *in_RAX;
  char *fromUri;
  char *local_18;
  
  if ((filename != (char *)0x0) &&
     (local_18 = in_RAX, iVar1 = xmlConvertUriToPath(filename,&local_18), -1 < iVar1)) {
    if (local_18 != (char *)0x0) {
      filename = local_18;
    }
    iVar1 = xmlCheckFilename(filename);
    (*xmlFree)(local_18);
    return iVar1;
  }
  return 0;
}

Assistant:

int
xmlNoNetExists(const char *filename) {
    char *fromUri;
    int ret;

    if (filename == NULL)
	return(0);

    if (xmlConvertUriToPath(filename, &fromUri) < 0)
        return(0);

    if (fromUri != NULL)
        filename = fromUri;

    ret =  xmlCheckFilename(filename);

    xmlFree(fromUri);
    return(ret);
}